

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# select.c
# Opt level: O1

int Curl_poll(pollfd *ufds,uint nfds,int timeout_ms)

{
  int iVar1;
  int iVar2;
  long lVar3;
  int *piVar4;
  timediff_t tVar5;
  char cVar6;
  ulong uVar7;
  curltime cVar8;
  curltime older;
  curltime newer;
  int local_3c;
  time_t local_38;
  
  if (nfds != 0 && ufds != (pollfd *)0x0) {
    lVar3 = 0;
    do {
      if (ufds[lVar3].fd != -1) {
        if (timeout_ms < 1) {
          iVar1 = 0;
          local_3c = 0;
          local_38 = 0;
        }
        else {
          cVar8 = Curl_now();
          local_38 = cVar8.tv_sec;
          local_3c = cVar8.tv_usec;
          iVar1 = timeout_ms;
        }
        goto LAB_004af4e0;
      }
      lVar3 = lVar3 + 1;
    } while (nfds != (uint)lVar3);
  }
  iVar1 = Curl_wait_ms(timeout_ms);
  return iVar1;
LAB_004af4e0:
  if (timeout_ms == 0) {
    iVar1 = timeout_ms;
  }
  if (timeout_ms < 0) {
    iVar1 = -1;
  }
  iVar2 = poll((pollfd *)ufds,(ulong)nfds,iVar1);
  if (iVar2 == -1) {
    piVar4 = __errno_location();
    iVar2 = *piVar4;
    if (iVar2 == 0) {
      if (0 < timeout_ms) goto LAB_004af531;
      cVar6 = '\0';
    }
    else {
      if (0 < timeout_ms && (iVar2 == 4 && Curl_ack_eintr == 0)) {
LAB_004af531:
        cVar8 = Curl_now();
        older.tv_usec = local_3c;
        older.tv_sec = local_38;
        older._12_4_ = 0;
        newer._12_4_ = 0;
        newer.tv_sec = SUB128(cVar8._0_12_,0);
        newer.tv_usec = SUB124(cVar8._0_12_,8);
        tVar5 = Curl_timediff(newer,older);
        iVar1 = timeout_ms - (int)tVar5;
        iVar2 = -(uint)(iVar1 != 0 && (int)tVar5 <= timeout_ms);
        cVar6 = (iVar1 < 1) * '\x05';
        goto LAB_004af56d;
      }
      cVar6 = (iVar2 != 4 || Curl_ack_eintr != 0) * '\x05';
    }
    iVar2 = -1;
  }
  else {
    cVar6 = '\x05';
  }
LAB_004af56d:
  if ((iVar2 != -1) || (cVar6 != '\0')) {
    if (iVar2 < 0) {
      iVar2 = -1;
    }
    else if (iVar2 == 0) {
      iVar2 = 0;
    }
    else {
      uVar7 = 0;
      do {
        if (ufds[uVar7].fd != -1) {
          if ((ufds[uVar7].revents & 0x10U) != 0) {
            ufds[uVar7].revents = ufds[uVar7].revents | 1;
          }
          if ((ufds[uVar7].revents & 8U) != 0) {
            ufds[uVar7].revents = ufds[uVar7].revents | 5;
          }
        }
        uVar7 = uVar7 + 1;
      } while (nfds + (nfds == 0) != uVar7);
    }
    return iVar2;
  }
  goto LAB_004af4e0;
}

Assistant:

int Curl_poll(struct pollfd ufds[], unsigned int nfds, int timeout_ms)
{
#ifndef HAVE_POLL_FINE
  struct timeval pending_tv;
  struct timeval *ptimeout;
  fd_set fds_read;
  fd_set fds_write;
  fd_set fds_err;
  curl_socket_t maxfd;
#endif
  struct curltime initial_tv = {0, 0};
  bool fds_none = TRUE;
  unsigned int i;
  int pending_ms = 0;
  int r;

  if(ufds) {
    for(i = 0; i < nfds; i++) {
      if(ufds[i].fd != CURL_SOCKET_BAD) {
        fds_none = FALSE;
        break;
      }
    }
  }
  if(fds_none) {
    r = Curl_wait_ms(timeout_ms);
    return r;
  }

  /* Avoid initial timestamp, avoid Curl_now() call, when elapsed
     time in this function does not need to be measured. This happens
     when function is called with a zero timeout or a negative timeout
     value indicating a blocking call should be performed. */

  if(timeout_ms > 0) {
    pending_ms = timeout_ms;
    initial_tv = Curl_now();
  }

#ifdef HAVE_POLL_FINE

  do {
    int error;
    if(timeout_ms < 0)
      pending_ms = -1;
    else if(!timeout_ms)
      pending_ms = 0;
    r = poll(ufds, nfds, pending_ms);
    if(r != -1)
      break;
    error = SOCKERRNO;
    if(error && ERROR_NOT_EINTR(error))
      break;
    if(timeout_ms > 0) {
      pending_ms = (int)(timeout_ms - ELAPSED_MS());
      if(pending_ms <= 0) {
        r = 0;  /* Simulate a "call timed out" case */
        break;
      }
    }
  } while(r == -1);

  if(r < 0)
    return -1;
  if(r == 0)
    return 0;

  for(i = 0; i < nfds; i++) {
    if(ufds[i].fd == CURL_SOCKET_BAD)
      continue;
    if(ufds[i].revents & POLLHUP)
      ufds[i].revents |= POLLIN;
    if(ufds[i].revents & POLLERR)
      ufds[i].revents |= (POLLIN|POLLOUT);
  }

#else  /* HAVE_POLL_FINE */

  FD_ZERO(&fds_read);
  FD_ZERO(&fds_write);
  FD_ZERO(&fds_err);
  maxfd = (curl_socket_t)-1;

  for(i = 0; i < nfds; i++) {
    ufds[i].revents = 0;
    if(ufds[i].fd == CURL_SOCKET_BAD)
      continue;
    VERIFY_SOCK(ufds[i].fd);
    if(ufds[i].events & (POLLIN|POLLOUT|POLLPRI|
                          POLLRDNORM|POLLWRNORM|POLLRDBAND)) {
      if(ufds[i].fd > maxfd)
        maxfd = ufds[i].fd;
      if(ufds[i].events & (POLLRDNORM|POLLIN))
        FD_SET(ufds[i].fd, &fds_read);
      if(ufds[i].events & (POLLWRNORM|POLLOUT))
        FD_SET(ufds[i].fd, &fds_write);
      if(ufds[i].events & (POLLRDBAND|POLLPRI))
        FD_SET(ufds[i].fd, &fds_err);
    }
  }

#ifdef USE_WINSOCK
  /* WinSock select() can't handle zero events.  See the comment about this in
     Curl_check_socket(). */
  if(fds_read.fd_count == 0 && fds_write.fd_count == 0
     && fds_err.fd_count == 0) {
    r = Curl_wait_ms(timeout_ms);
    return r;
  }
#endif

  ptimeout = (timeout_ms < 0) ? NULL : &pending_tv;

  do {
    int error;
    if(timeout_ms > 0) {
      pending_tv.tv_sec = pending_ms / 1000;
      pending_tv.tv_usec = (pending_ms % 1000) * 1000;
    }
    else if(!timeout_ms) {
      pending_tv.tv_sec = 0;
      pending_tv.tv_usec = 0;
    }

#ifdef USE_WINSOCK
    r = select((int)maxfd + 1,
               /* WinSock select() can't handle fd_sets with zero bits set, so
                  don't give it such arguments.  See the comment about this in
                  Curl_check_socket().
               */
               fds_read.fd_count ? &fds_read : NULL,
               fds_write.fd_count ? &fds_write : NULL,
               fds_err.fd_count ? &fds_err : NULL, ptimeout);
#else
    r = select((int)maxfd + 1, &fds_read, &fds_write, &fds_err, ptimeout);
#endif
    if(r != -1)
      break;
    error = SOCKERRNO;
    if(error && ERROR_NOT_EINTR(error))
      break;
    if(timeout_ms > 0) {
      pending_ms = timeout_ms - ELAPSED_MS();
      if(pending_ms <= 0) {
        r = 0;  /* Simulate a "call timed out" case */
        break;
      }
    }
  } while(r == -1);

  if(r < 0)
    return -1;
  if(r == 0)
    return 0;

  r = 0;
  for(i = 0; i < nfds; i++) {
    ufds[i].revents = 0;
    if(ufds[i].fd == CURL_SOCKET_BAD)
      continue;
    if(FD_ISSET(ufds[i].fd, &fds_read))
      ufds[i].revents |= POLLIN;
    if(FD_ISSET(ufds[i].fd, &fds_write))
      ufds[i].revents |= POLLOUT;
    if(FD_ISSET(ufds[i].fd, &fds_err))
      ufds[i].revents |= POLLPRI;
    if(ufds[i].revents != 0)
      r++;
  }

#endif  /* HAVE_POLL_FINE */

  return r;
}